

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void verifyDbFile(unixFile *pFile)

{
  int iVar1;
  undefined1 local_a0 [4];
  int rc;
  stat buf;
  unixFile *pFile_local;
  
  if ((pFile->ctrlFlags & 0x80) == 0) {
    buf.__glibc_reserved[2] = (__syscall_slong_t)pFile;
    iVar1 = (*aSyscall[5].pCurrent)((ulong)(uint)pFile->h,local_a0);
    if (iVar1 == 0) {
      if (buf.st_ino == 0) {
        sqlite3_log(0x1c,"file unlinked while open: %s",
                    *(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
      }
      else if (buf.st_ino < 2) {
        iVar1 = fileHasMoved((unixFile *)buf.__glibc_reserved[2]);
        if (iVar1 != 0) {
          sqlite3_log(0x1c,"file renamed while open: %s",
                      *(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
        }
      }
      else {
        sqlite3_log(0x1c,"multiple links to file: %s",
                    *(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
      }
    }
    else {
      sqlite3_log(0x1c,"cannot fstat db file %s",*(undefined8 *)(buf.__glibc_reserved[2] + 0x38));
    }
  }
  return;
}

Assistant:

static void verifyDbFile(unixFile *pFile){
  struct stat buf;
  int rc;

  /* These verifications occurs for the main database only */
  if( pFile->ctrlFlags & UNIXFILE_NOLOCK ) return;

  rc = osFstat(pFile->h, &buf);
  if( rc!=0 ){
    sqlite3_log(SQLITE_WARNING, "cannot fstat db file %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink==0 ){
    sqlite3_log(SQLITE_WARNING, "file unlinked while open: %s", pFile->zPath);
    return;
  }
  if( buf.st_nlink>1 ){
    sqlite3_log(SQLITE_WARNING, "multiple links to file: %s", pFile->zPath);
    return;
  }
  if( fileHasMoved(pFile) ){
    sqlite3_log(SQLITE_WARNING, "file renamed while open: %s", pFile->zPath);
    return;
  }
}